

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O3

void __thiscall CLIListener::on_error(CLIListener *this,Poll *p,int event)

{
  ostream *poVar1;
  long *plStack_48;
  long lStack_40;
  long alStack_38 [2];
  
  if ((event & 0x10U) != 0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->super_Subscriber).name._M_dataplus._M_p,
                        (this->super_Subscriber).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": Ignoring POLLHUP",0x12);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->super_Subscriber).name._M_dataplus._M_p,
                      (this->super_Subscriber).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": on_error event_code=",0x16);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,event);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," errno=",7);
  from_errno_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)plStack_48,lStack_40);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (plStack_48 != alStack_38) {
    operator_delete(plStack_48,alStack_38[0] + 1);
  }
  Poll::unsubscribe(p,&this->super_Subscriber);
  return;
}

Assistant:

void CLIListener::on_error(Poll &p, int event) {
  if (event & POLLHUP) {
    std::cout << name << ": Ignoring POLLHUP" << std::endl;
    return;
  }
  Subscriber::on_error(p, event);
}